

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupport.cpp
# Opt level: O2

MockSupport * __thiscall MockSupport::getMockSupport(MockSupport *this,MockNamedValueListNode *node)

{
  bool bVar1;
  int iVar2;
  MockNamedValue *pMVar3;
  undefined4 extraout_var;
  SimpleString local_50;
  SimpleString local_40;
  SimpleString local_30;
  SimpleString local_20;
  
  MockNamedValueListNode::getType((MockNamedValueListNode *)&local_40);
  SimpleString::SimpleString(&local_50,"MockSupport");
  bVar1 = operator==(&local_40,&local_50);
  if (bVar1) {
    MockNamedValueListNode::getName((MockNamedValueListNode *)&local_20);
    SimpleString::SimpleString(&local_30,"!!!$$$MockingSupportScope$$$!!!");
    bVar1 = SimpleString::contains(&local_20,&local_30);
    SimpleString::~SimpleString(&local_30);
    SimpleString::~SimpleString(&local_20);
    SimpleString::~SimpleString(&local_50);
    SimpleString::~SimpleString(&local_40);
    if (bVar1) {
      pMVar3 = MockNamedValueListNode::item(node);
      iVar2 = (*pMVar3->_vptr_MockNamedValue[0x28])(pMVar3);
      return (MockSupport *)CONCAT44(extraout_var,iVar2);
    }
  }
  else {
    SimpleString::~SimpleString(&local_50);
    SimpleString::~SimpleString(&local_40);
  }
  return (MockSupport *)0x0;
}

Assistant:

MockSupport* MockSupport::getMockSupport(MockNamedValueListNode* node)
{
    if (node->getType() == "MockSupport" && node->getName().contains(MOCK_SUPPORT_SCOPE_PREFIX))
        return (MockSupport*) node->item()->getObjectPointer();
    return NULLPTR;
}